

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O0

_Bool Curl_sasl_can_authenticate(SASL *sasl,connectdata *conn)

{
  connectdata *conn_local;
  SASL *sasl_local;
  
  if ((*(uint *)&(conn->bits).field_0x4 >> 8 & 1) == 0) {
    if ((sasl->authmechs & sasl->prefmech & 0x20) == 0) {
      sasl_local._7_1_ = false;
    }
    else {
      sasl_local._7_1_ = true;
    }
  }
  else {
    sasl_local._7_1_ = true;
  }
  return sasl_local._7_1_;
}

Assistant:

bool Curl_sasl_can_authenticate(struct SASL *sasl, struct connectdata *conn)
{
  /* Have credentials been provided? */
  if(conn->bits.user_passwd)
    return TRUE;

  /* EXTERNAL can authenticate without a user name and/or password */
  if(sasl->authmechs & sasl->prefmech & SASL_MECH_EXTERNAL)
    return TRUE;

  return FALSE;
}